

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<std::__cxx11::string_const&,char_const(&)[23],std::__cxx11::string_const&,char_const(&)[14]>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,
                   char (*b) [23],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [14])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  size_t local_78;
  char (*local_70) [23];
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  size_t local_48;
  char (*local_40) [14];
  undefined8 local_38;
  
  local_90.first._M_str = (a->_M_dataplus)._M_p;
  local_90.first._M_len = a->_M_string_length;
  local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78 = strlen(*b);
  local_68 = 0;
  local_58 = (args->_M_dataplus)._M_p;
  local_60 = args->_M_string_length;
  local_50 = 0;
  local_70 = b;
  local_48 = strlen(*args_1);
  local_38 = 0;
  views._M_len = 4;
  views._M_array = &local_90;
  local_40 = args_1;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}